

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::DOMAttrImpl::getValue(DOMAttrImpl *this)

{
  short *psVar1;
  short *psVar2;
  DOMDocument *pDVar3;
  DOMNode *node;
  XMLCh *src;
  XMLSize_t XVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  long lVar9;
  undefined8 *puVar10;
  DOMException *pDVar11;
  DOMNode *pDVar12;
  XMLCh XVar13;
  undefined8 *puVar14;
  XMLCh *pXVar15;
  XMLBuffer buf;
  XMLBuffer local_68;
  undefined4 extraout_var_01;
  
  pDVar12 = (this->fParent).fFirstChild;
  if (pDVar12 == (DOMNode *)0x0) {
    pXVar15 = L"";
  }
  else {
    plVar6 = (long *)__dynamic_cast(pDVar12,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo,
                                    0xfffffffffffffffe);
    if ((plVar6 == (long *)0x0) || (lVar7 = (**(code **)(*plVar6 + 0x10))(plVar6), lVar7 == 0)) {
      pDVar11 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(pDVar11,0xb,0,XMLPlatformUtils::fgMemoryManager);
      __cxa_throw(pDVar11,&DOMException::typeinfo,DOMException::~DOMException);
    }
    lVar7 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if ((*(long *)(lVar7 + 8) == 0) &&
       (iVar5 = (*((this->fParent).fFirstChild)->_vptr_DOMNode[4])(), iVar5 == 3)) {
      iVar5 = (*((this->fParent).fFirstChild)->_vptr_DOMNode[3])();
      return (XMLCh *)CONCAT44(extraout_var,iVar5);
    }
    pDVar3 = (this->fParent).fOwnerDocument;
    pDVar12 = &pDVar3[-1].super_DOMNode;
    if (pDVar3 == (DOMDocument *)0x0) {
      pDVar12 = (DOMNode *)0x0;
    }
    local_68.fMemoryManager = *(MemoryManager **)(pDVar12 + 0x2c);
    local_68.fIndex = 0;
    local_68.fCapacity = 0x3ff;
    local_68.fFullSize = 0;
    local_68.fUsed = false;
    local_68.fFullHandler = (XMLBufferFullHandler *)0x0;
    iVar5 = (*(local_68.fMemoryManager)->_vptr_MemoryManager[3])(local_68.fMemoryManager,0x800);
    *(XMLCh *)CONCAT44(extraout_var_00,iVar5) = L'\0';
    node = (this->fParent).fFirstChild;
    src = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
    XVar4 = 0;
    while (local_68.fBuffer = src, node != (DOMNode *)0x0) {
      getTextValue(this,node,&local_68);
      plVar6 = (long *)__dynamic_cast(node,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo,
                                      0xfffffffffffffffe);
      if ((plVar6 == (long *)0x0) || (lVar7 = (**(code **)(*plVar6 + 0x10))(plVar6), lVar7 == 0)) {
        pDVar11 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(pDVar11,0xb,0,XMLPlatformUtils::fgMemoryManager);
        __cxa_throw(pDVar11,&DOMException::typeinfo,DOMException::~DOMException);
      }
      lVar7 = (**(code **)(*plVar6 + 0x10))(plVar6);
      src = local_68.fBuffer;
      XVar4 = local_68.fIndex;
      node = *(DOMNode **)(lVar7 + 8);
    }
    src[XVar4] = L'\0';
    lVar7 = 0;
    do {
      psVar1 = (short *)((long)src + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar1 != 0);
    uVar8 = (ulong)(ushort)*src;
    if (uVar8 == 0) {
      uVar8 = 0;
    }
    else {
      XVar13 = src[1];
      if (XVar13 != L'\0') {
        pXVar15 = src + 2;
        do {
          uVar8 = (ulong)(ushort)XVar13 + (uVar8 >> 0x18) + uVar8 * 0x26;
          XVar13 = *pXVar15;
          pXVar15 = pXVar15 + 1;
        } while (XVar13 != L'\0');
      }
      uVar8 = uVar8 % *(ulong *)(pDVar12 + 0x28);
    }
    lVar7 = (lVar7 >> 1) + -1;
    puVar10 = *(undefined8 **)(*(long *)(pDVar12 + 0x27) + uVar8 * 8);
    if (puVar10 == (undefined8 *)0x0) {
      puVar14 = (undefined8 *)(*(long *)(pDVar12 + 0x27) + uVar8 * 8);
    }
    else {
      do {
        puVar14 = puVar10;
        if (puVar14[1] == lVar7) {
          pXVar15 = (XMLCh *)(puVar14 + 2);
          if (pXVar15 == src) goto LAB_00259b03;
          lVar9 = 0;
          do {
            psVar1 = (short *)((long)pXVar15 + lVar9);
            if (*psVar1 == 0) {
              if (*(short *)((long)src + lVar9) == 0) goto LAB_00259b03;
              break;
            }
            psVar2 = (short *)((long)src + lVar9);
            lVar9 = lVar9 + 2;
          } while (*psVar1 == *psVar2);
        }
        puVar10 = (undefined8 *)*puVar14;
      } while ((undefined8 *)*puVar14 != (undefined8 *)0x0);
    }
    iVar5 = (*pDVar12->_vptr_DOMNode[4])(pDVar12,lVar7 * 2 + 0x18);
    puVar10 = (undefined8 *)CONCAT44(extraout_var_01,iVar5);
    *puVar14 = puVar10;
    puVar10[1] = lVar7;
    *puVar10 = 0;
    pXVar15 = (XMLCh *)(puVar10 + 2);
    XMLString::copyString(pXVar15,src);
LAB_00259b03:
    (*(local_68.fMemoryManager)->_vptr_MemoryManager[4])(local_68.fMemoryManager,local_68.fBuffer);
  }
  return pXVar15;
}

Assistant:

const XMLCh * DOMAttrImpl::getValue() const
{
    if (fParent.fFirstChild == 0) {
        return XMLUni::fgZeroLenString; // return "";
    }

    // Simple case where attribute value is just a single text node
    DOMNode *node = castToChildImpl(fParent.fFirstChild)->nextSibling;
    if (node == 0 && fParent.fFirstChild->getNodeType() == DOMNode::TEXT_NODE) {
        return fParent.fFirstChild->getNodeValue();
    }

    //
    // Complicated case where attribute value is a DOM tree
    //
    // According to the spec, the child nodes of the Attr node may be either
    // Text or EntityReference nodes.
    //
    // The parser will not create such thing, this is for those created by users.
    //
    // In such case, we have to visit each child to retrieve the text
    //

    DOMDocumentImpl* doc = (DOMDocumentImpl*)fParent.fOwnerDocument;

    XMLBuffer buf(1023, doc->getMemoryManager());
    for (node = fParent.fFirstChild; node != 0; node = castToChildImpl(node)->nextSibling)
        getTextValue(node, buf);

    return doc->getPooledString(buf.getRawBuffer());
}